

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::CatalogSet::CreateCommittedEntry
          (CatalogSet *this,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *entry)

{
  pointer pCVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_28;
  
  pCVar1 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(entry);
  oVar2 = CatalogEntryMap::GetEntry(&this->map,&pCVar1->name);
  if (oVar2.ptr == (CatalogEntry *)0x0) {
    _Var3._M_head_impl =
         (entry->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    pCVar1 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->(entry);
    (pCVar1->set).ptr = this;
    pCVar1 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->(entry);
    LOCK();
    (pCVar1->timestamp).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    local_28._M_head_impl =
         (entry->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    (entry->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t
    .super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
    CatalogEntryMap::AddEntry
              (&this->map,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_28);
    if (local_28._M_head_impl != (CatalogEntry *)0x0) {
      (*(local_28._M_head_impl)->_vptr_CatalogEntry[1])();
    }
  }
  else {
    _Var3._M_head_impl = (CatalogEntry *)0x0;
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)_Var3._M_head_impl;
}

Assistant:

optional_ptr<CatalogEntry> CatalogSet::CreateCommittedEntry(unique_ptr<CatalogEntry> entry) {
	auto existing_entry = map.GetEntry(entry->name);
	if (existing_entry) {
		// Return null if an entry by that name already exists
		return nullptr;
	}

	auto catalog_entry = entry.get();

	entry->set = this;
	// Give the entry commit id 0, so it is visible to all transactions
	entry->timestamp = 0;
	map.AddEntry(std::move(entry));

	return catalog_entry;
}